

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formats.h
# Opt level: O3

bool ktx::isFormatNotSRGBButHasSRGBVariant(VkFormat format)

{
  if ((int)format < 0x83) {
    if ((format < VK_FORMAT_A8B8G8R8_SRGB_PACK32) &&
       ((0x19b366cd9b36600U >> ((ulong)format & 0x3f) & 1) != 0)) {
      return true;
    }
  }
  else if ((((format - VK_FORMAT_BC1_RGB_UNORM_BLOCK < 0x35) &&
            ((0x15555554154055U >> ((ulong)(format - VK_FORMAT_BC1_RGB_UNORM_BLOCK) & 0x3f) & 1) !=
             0)) || ((format + 0xc460d100 < 0x1c &&
                     ((0x9249249U >> (format + 0xc460d100 & 0x1f) & 1) != 0)))) ||
          (format + 0xc4646310 < 4)) {
    return true;
  }
  return false;
}

Assistant:

[[nodiscard]] constexpr inline bool isFormatNotSRGBButHasSRGBVariant(VkFormat format) noexcept {
    switch (format) {
    //   VK_FORMAT_R8_SRGB
    case VK_FORMAT_R8_UNORM: [[fallthrough]];
    case VK_FORMAT_R8_SNORM: [[fallthrough]];
    case VK_FORMAT_R8_UINT: [[fallthrough]];
    case VK_FORMAT_R8_SINT: [[fallthrough]];

    //   VK_FORMAT_R8G8_SRGB
    case VK_FORMAT_R8G8_UNORM: [[fallthrough]];
    case VK_FORMAT_R8G8_SNORM: [[fallthrough]];
    case VK_FORMAT_R8G8_UINT: [[fallthrough]];
    case VK_FORMAT_R8G8_SINT: [[fallthrough]];

    //   VK_FORMAT_R8G8B8_SRGB
    case VK_FORMAT_R8G8B8_UNORM: [[fallthrough]];
    case VK_FORMAT_R8G8B8_SNORM: [[fallthrough]];
    case VK_FORMAT_R8G8B8_UINT: [[fallthrough]];
    case VK_FORMAT_R8G8B8_SINT: [[fallthrough]];

    //   VK_FORMAT_B8G8R8_SRGB
    case VK_FORMAT_B8G8R8_UNORM: [[fallthrough]];
    case VK_FORMAT_B8G8R8_SNORM: [[fallthrough]];
    case VK_FORMAT_B8G8R8_UINT: [[fallthrough]];
    case VK_FORMAT_B8G8R8_SINT: [[fallthrough]];

    //   VK_FORMAT_R8G8B8A8_SRGB
    case VK_FORMAT_R8G8B8A8_UNORM: [[fallthrough]];
    case VK_FORMAT_R8G8B8A8_SNORM: [[fallthrough]];
    case VK_FORMAT_R8G8B8A8_UINT: [[fallthrough]];
    case VK_FORMAT_R8G8B8A8_SINT: [[fallthrough]];

    //   VK_FORMAT_B8G8R8A8_SRGB
    case VK_FORMAT_B8G8R8A8_UNORM: [[fallthrough]];
    case VK_FORMAT_B8G8R8A8_SNORM: [[fallthrough]];
    case VK_FORMAT_B8G8R8A8_UINT: [[fallthrough]];
    case VK_FORMAT_B8G8R8A8_SINT: [[fallthrough]];

    //   VK_FORMAT_A8B8G8R8_SRGB_PACK32
    case VK_FORMAT_A8B8G8R8_UNORM_PACK32: [[fallthrough]];
    case VK_FORMAT_A8B8G8R8_SNORM_PACK32: [[fallthrough]];
    case VK_FORMAT_A8B8G8R8_UINT_PACK32: [[fallthrough]];
    case VK_FORMAT_A8B8G8R8_SINT_PACK32: [[fallthrough]];

    //   VK_FORMAT_BC1_RGB_SRGB_BLOCK
    case VK_FORMAT_BC1_RGB_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_BC1_RGBA_SRGB_BLOCK
    case VK_FORMAT_BC1_RGBA_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_BC2_SRGB_BLOCK
    case VK_FORMAT_BC2_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_BC3_SRGB_BLOCK
    case VK_FORMAT_BC3_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_BC7_SRGB_BLOCK
    case VK_FORMAT_BC7_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK
    case VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK
    case VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK
    case VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_ASTC_4x4_SRGB_BLOCK
    case VK_FORMAT_ASTC_4x4_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_ASTC_5x4_SRGB_BLOCK
    case VK_FORMAT_ASTC_5x4_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_ASTC_5x5_SRGB_BLOCK
    case VK_FORMAT_ASTC_5x5_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_ASTC_6x5_SRGB_BLOCK
    case VK_FORMAT_ASTC_6x5_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_ASTC_6x6_SRGB_BLOCK
    case VK_FORMAT_ASTC_6x6_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_ASTC_8x5_SRGB_BLOCK
    case VK_FORMAT_ASTC_8x5_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_ASTC_8x6_SRGB_BLOCK
    case VK_FORMAT_ASTC_8x6_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_ASTC_8x8_SRGB_BLOCK
    case VK_FORMAT_ASTC_8x8_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_ASTC_10x5_SRGB_BLOCK
    case VK_FORMAT_ASTC_10x5_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_ASTC_10x6_SRGB_BLOCK
    case VK_FORMAT_ASTC_10x6_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_ASTC_10x8_SRGB_BLOCK
    case VK_FORMAT_ASTC_10x8_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_ASTC_10x10_SRGB_BLOCK
    case VK_FORMAT_ASTC_10x10_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_ASTC_12x10_SRGB_BLOCK
    case VK_FORMAT_ASTC_12x10_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_ASTC_12x12_SRGB_BLOCK
    case VK_FORMAT_ASTC_12x12_UNORM_BLOCK: [[fallthrough]];

    //   VK_FORMAT_PVRTC1_2BPP_SRGB_BLOCK_IMG
    case VK_FORMAT_PVRTC1_2BPP_UNORM_BLOCK_IMG: [[fallthrough]];

    //   VK_FORMAT_PVRTC1_4BPP_SRGB_BLOCK_IMG
    case VK_FORMAT_PVRTC1_4BPP_UNORM_BLOCK_IMG: [[fallthrough]];

    //   VK_FORMAT_PVRTC2_2BPP_SRGB_BLOCK_IMG
    case VK_FORMAT_PVRTC2_2BPP_UNORM_BLOCK_IMG: [[fallthrough]];

    //   VK_FORMAT_PVRTC2_4BPP_SRGB_BLOCK_IMG
    case VK_FORMAT_PVRTC2_4BPP_UNORM_BLOCK_IMG: [[fallthrough]];

    //   VK_FORMAT_ASTC_3x3x3_SRGB_BLOCK_EXT
    case VK_FORMAT_ASTC_3x3x3_UNORM_BLOCK_EXT: [[fallthrough]];

    //   VK_FORMAT_ASTC_4x3x3_SRGB_BLOCK_EXT
    case VK_FORMAT_ASTC_4x3x3_UNORM_BLOCK_EXT: [[fallthrough]];

    //   VK_FORMAT_ASTC_4x4x3_SRGB_BLOCK_EXT
    case VK_FORMAT_ASTC_4x4x3_UNORM_BLOCK_EXT: [[fallthrough]];

    //   VK_FORMAT_ASTC_4x4x4_SRGB_BLOCK_EXT
    case VK_FORMAT_ASTC_4x4x4_UNORM_BLOCK_EXT: [[fallthrough]];

    //   VK_FORMAT_ASTC_5x4x4_SRGB_BLOCK_EXT
    case VK_FORMAT_ASTC_5x4x4_UNORM_BLOCK_EXT: [[fallthrough]];

    //   VK_FORMAT_ASTC_5x5x4_SRGB_BLOCK_EXT
    case VK_FORMAT_ASTC_5x5x4_UNORM_BLOCK_EXT: [[fallthrough]];

    //   VK_FORMAT_ASTC_5x5x5_SRGB_BLOCK_EXT
    case VK_FORMAT_ASTC_5x5x5_UNORM_BLOCK_EXT: [[fallthrough]];

    //   VK_FORMAT_ASTC_6x5x5_SRGB_BLOCK_EXT
    case VK_FORMAT_ASTC_6x5x5_UNORM_BLOCK_EXT: [[fallthrough]];

    //   VK_FORMAT_ASTC_6x6x5_SRGB_BLOCK_EXT
    case VK_FORMAT_ASTC_6x6x5_UNORM_BLOCK_EXT: [[fallthrough]];

    //   VK_FORMAT_ASTC_6x6x6_SRGB_BLOCK_EXT
    case VK_FORMAT_ASTC_6x6x6_UNORM_BLOCK_EXT:
        return true;
    default:
        return false;
    }
}